

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O3

SmallVector<diligent_spirv_cross::Variant,_8UL> * __thiscall
diligent_spirv_cross::SmallVector<diligent_spirv_cross::Variant,_8UL>::operator=
          (SmallVector<diligent_spirv_cross::Variant,_8UL> *this,
          SmallVector<diligent_spirv_cross::Variant,_8UL> *other)

{
  undefined8 *puVar1;
  Variant *pVVar2;
  size_t sVar3;
  Variant *pVVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  clear(this);
  pVVar4 = (other->super_VectorView<diligent_spirv_cross::Variant>).ptr;
  if (pVVar4 == (Variant *)&other->stack_storage) {
    reserve(this,(other->super_VectorView<diligent_spirv_cross::Variant>).buffer_size);
    if ((other->super_VectorView<diligent_spirv_cross::Variant>).buffer_size == 0) {
      uVar5 = 0;
    }
    else {
      lVar7 = 0;
      uVar6 = 0;
      do {
        pVVar4 = (this->super_VectorView<diligent_spirv_cross::Variant>).ptr;
        pVVar2 = (other->super_VectorView<diligent_spirv_cross::Variant>).ptr;
        puVar1 = (undefined8 *)((long)&pVVar4->group + lVar7);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined8 *)((long)&pVVar4->holder + lVar7 + 5) = 0;
        Variant::operator=((Variant *)((long)&pVVar4->group + lVar7),
                           (Variant *)((long)&pVVar2->group + lVar7));
        Variant::~Variant((Variant *)
                          ((long)&((other->super_VectorView<diligent_spirv_cross::Variant>).ptr)->
                                  group + lVar7));
        uVar6 = uVar6 + 1;
        uVar5 = (other->super_VectorView<diligent_spirv_cross::Variant>).buffer_size;
        lVar7 = lVar7 + 0x18;
      } while (uVar6 < uVar5);
    }
    (this->super_VectorView<diligent_spirv_cross::Variant>).buffer_size = uVar5;
    (other->super_VectorView<diligent_spirv_cross::Variant>).buffer_size = 0;
  }
  else {
    pVVar2 = (this->super_VectorView<diligent_spirv_cross::Variant>).ptr;
    if (pVVar2 != (Variant *)&this->stack_storage) {
      free(pVVar2);
      pVVar4 = (other->super_VectorView<diligent_spirv_cross::Variant>).ptr;
    }
    (this->super_VectorView<diligent_spirv_cross::Variant>).ptr = pVVar4;
    sVar3 = other->buffer_capacity;
    (this->super_VectorView<diligent_spirv_cross::Variant>).buffer_size =
         (other->super_VectorView<diligent_spirv_cross::Variant>).buffer_size;
    this->buffer_capacity = sVar3;
    (other->super_VectorView<diligent_spirv_cross::Variant>).ptr = (Variant *)0x0;
    (other->super_VectorView<diligent_spirv_cross::Variant>).buffer_size = 0;
    other->buffer_capacity = 0;
  }
  return this;
}

Assistant:

SmallVector &operator=(SmallVector &&other) SPIRV_CROSS_NOEXCEPT
	{
		clear();
		if (other.ptr != other.stack_storage.data())
		{
			// Pilfer allocated pointer.
			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = other.ptr;
			this->buffer_size = other.buffer_size;
			buffer_capacity = other.buffer_capacity;
			other.ptr = nullptr;
			other.buffer_size = 0;
			other.buffer_capacity = 0;
		}
		else
		{
			// Need to move the stack contents individually.
			reserve(other.buffer_size);
			for (size_t i = 0; i < other.buffer_size; i++)
			{
				new (&this->ptr[i]) T(std::move(other.ptr[i]));
				other.ptr[i].~T();
			}
			this->buffer_size = other.buffer_size;
			other.buffer_size = 0;
		}
		return *this;
	}